

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool __thiscall ImGuiListClipper::Step(ImGuiListClipper *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  char cVar7;
  int iVar8;
  ImGuiWindow *pIVar9;
  long lVar10;
  ImGuiTable *pIVar11;
  ImGuiContext *pIVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  ImGuiListClipperRange *pIVar16;
  int *in_RDI;
  bool bVar17;
  ImRect IVar18;
  int m2;
  int m1;
  int i;
  int off_max;
  int off_min;
  ImRect nav_rect_abs;
  bool is_nav_request;
  int already_submitted;
  bool affected_by_floating_point_precision;
  bool calc_clipping;
  ImGuiTable *table;
  ImGuiListClipperData *data;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int in_stack_fffffffffffffe8c;
  ImGuiListClipper *in_stack_fffffffffffffe90;
  bool local_162;
  long in_stack_fffffffffffffea8;
  ImVector<ImGuiListClipperRange> *in_stack_fffffffffffffeb0;
  bool local_131;
  int local_114;
  float fStack_c4;
  float fStack_bc;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  bool local_1;
  
  pIVar12 = GImGui;
  pIVar9 = GImGui->CurrentWindow;
  lVar10 = *(long *)(in_RDI + 6);
  pIVar11 = GImGui->CurrentTable;
  if ((pIVar11 != (ImGuiTable *)0x0) && ((pIVar11->IsInsideRow & 1U) != 0)) {
    ImGui::TableEndRow((ImGuiTable *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  if ((in_RDI[2] == 0) || (bVar13 = GetSkipItemForListClipping(), bVar13)) {
    End(in_stack_fffffffffffffe90);
    local_1 = false;
  }
  else if (((*(int *)(lVar10 + 0xc) == 0) && (pIVar11 != (ImGuiTable *)0x0)) &&
          ((pIVar11->IsUnfrozenRows & 1U) == 0)) {
    *in_RDI = *(int *)(lVar10 + 0x10);
    in_RDI[1] = *(int *)(lVar10 + 0x10) + 1;
    if (*in_RDI < in_RDI[2]) {
      *(int *)(lVar10 + 0x10) = *(int *)(lVar10 + 0x10) + 1;
      local_1 = true;
    }
    else {
      End(in_stack_fffffffffffffe90);
      local_1 = false;
    }
  }
  else {
    bVar13 = false;
    if (*(int *)(lVar10 + 0xc) == 0) {
      in_RDI[4] = (int)(pIVar9->DC).CursorPos.y;
      if ((float)in_RDI[3] <= 0.0) {
        ImGuiListClipperRange::FromIndices(*(int *)(lVar10 + 0x10),*(int *)(lVar10 + 0x10) + 1);
        ImVector<ImGuiListClipperRange>::push_front
                  ((ImVector<ImGuiListClipperRange> *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (ImGuiListClipperRange *)
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        pIVar16 = ImVector<ImGuiListClipperRange>::operator[]
                            ((ImVector<ImGuiListClipperRange> *)(lVar10 + 0x18),0);
        iVar14 = ImMax<int>(pIVar16->Min,*(int *)(lVar10 + 0x10));
        *in_RDI = iVar14;
        pIVar16 = ImVector<ImGuiListClipperRange>::operator[]
                            ((ImVector<ImGuiListClipperRange> *)(lVar10 + 0x18),0);
        iVar14 = ImMin<int>(pIVar16->Max,in_RDI[2]);
        in_RDI[1] = iVar14;
        if (*in_RDI == in_RDI[1]) {
          End(in_stack_fffffffffffffe90);
          return false;
        }
        *(undefined4 *)(lVar10 + 0xc) = 1;
        return true;
      }
      bVar13 = true;
    }
    if ((float)in_RDI[3] <= 0.0) {
      in_RDI[3] = (int)(((pIVar9->DC).CursorPos.y - (float)in_RDI[4]) / (float)(in_RDI[1] - *in_RDI)
                       );
      bVar13 = ImIsFloatAboveGuaranteedIntegerPrecision((float)in_RDI[4]);
      local_131 = true;
      if (!bVar13) {
        local_131 = ImIsFloatAboveGuaranteedIntegerPrecision((pIVar9->DC).CursorPos.y);
      }
      if (local_131 != false) {
        in_RDI[3] = (int)((pIVar9->DC).PrevLineSize.y + (pIVar12->Style).ItemSpacing.y);
      }
      bVar13 = true;
    }
    iVar14 = in_RDI[1];
    if (bVar13) {
      if ((pIVar12->LogEnabled & 1U) == 0) {
        bVar13 = false;
        if (((pIVar12->NavMoveScoringItems & 1U) != 0) &&
           (bVar13 = false, pIVar12->NavWindow != (ImGuiWindow *)0x0)) {
          bVar13 = pIVar12->NavWindow->RootWindowForNav == pIVar9->RootWindowForNav;
        }
        if (bVar13) {
          in_stack_fffffffffffffeb0 = (ImVector<ImGuiListClipperRange> *)(lVar10 + 0x18);
          ImGuiListClipperRange::FromPositions
                    ((pIVar12->NavScoringNoClipRect).Min.y,(pIVar12->NavScoringNoClipRect).Max.y,0,0
                    );
          ImVector<ImGuiListClipperRange>::push_back
                    ((ImVector<ImGuiListClipperRange> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     (ImGuiListClipperRange *)
                     CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          if (((pIVar12->NavMoveFlags & 0x400U) != 0) && (pIVar12->NavTabbingDir == -1)) {
            in_stack_fffffffffffffea8 = lVar10 + 0x18;
            ImGuiListClipperRange::FromIndices(in_RDI[2] + -1,in_RDI[2]);
            ImVector<ImGuiListClipperRange>::push_back
                      ((ImVector<ImGuiListClipperRange> *)
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       (ImGuiListClipperRange *)
                       CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          }
        }
        IVar18 = ImGui::WindowRectRelToAbs
                           ((ImGuiWindow *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            (ImRect *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
        ;
        if ((pIVar12->NavId != 0) && (pIVar9->NavLastIds[0] == pIVar12->NavId)) {
          fStack_c4 = IVar18.Min.y;
          fStack_bc = IVar18.Max.y;
          ImGuiListClipperRange::FromPositions(fStack_c4,fStack_bc,0,0);
          ImVector<ImGuiListClipperRange>::push_back
                    ((ImVector<ImGuiListClipperRange> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     (ImGuiListClipperRange *)
                     CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        }
        bVar17 = false;
        if (bVar13) {
          bVar17 = pIVar12->NavMoveClipDir == 2;
        }
        iVar15 = 0;
        if (bVar17) {
          iVar15 = -1;
        }
        local_162 = false;
        if (bVar13) {
          local_162 = pIVar12->NavMoveClipDir == 3;
        }
        in_stack_fffffffffffffe90 = (ImGuiListClipper *)(lVar10 + 0x18);
        ImGuiListClipperRange::FromPositions
                  ((pIVar9->ClipRect).Min.y,(pIVar9->ClipRect).Max.y,iVar15,(uint)local_162);
        ImVector<ImGuiListClipperRange>::push_back
                  ((ImVector<ImGuiListClipperRange> *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (ImGuiListClipperRange *)
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      }
      else {
        ImGuiListClipperRange::FromIndices(0,in_RDI[2]);
        ImVector<ImGuiListClipperRange>::push_back
                  ((ImVector<ImGuiListClipperRange> *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (ImGuiListClipperRange *)
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      }
      for (local_114 = 0; local_114 < *(int *)(lVar10 + 0x18); local_114 = local_114 + 1) {
        pIVar16 = ImVector<ImGuiListClipperRange>::operator[]
                            ((ImVector<ImGuiListClipperRange> *)(lVar10 + 0x18),local_114);
        if ((pIVar16->PosToIndexConvert & 1U) != 0) {
          pIVar16 = ImVector<ImGuiListClipperRange>::operator[]
                              ((ImVector<ImGuiListClipperRange> *)(lVar10 + 0x18),local_114);
          iVar15 = pIVar16->Min;
          fVar1 = (pIVar9->DC).CursorPos.y;
          fVar2 = *(float *)(lVar10 + 8);
          fVar3 = (float)in_RDI[3];
          pIVar16 = ImVector<ImGuiListClipperRange>::operator[]
                              ((ImVector<ImGuiListClipperRange> *)(lVar10 + 0x18),local_114);
          iVar8 = pIVar16->Max;
          fVar4 = (pIVar9->DC).CursorPos.y;
          fVar5 = *(float *)(lVar10 + 8);
          fVar6 = (float)in_RDI[3];
          iVar15 = iVar14 + (int)((((float)iVar15 - fVar1) - fVar2) / fVar3);
          pIVar16 = ImVector<ImGuiListClipperRange>::operator[]
                              ((ImVector<ImGuiListClipperRange> *)(lVar10 + 0x18),local_114);
          iVar15 = ImClamp<int>(iVar15 + pIVar16->PosToIndexOffsetMin,iVar14,in_RDI[2] + -1);
          pIVar16 = ImVector<ImGuiListClipperRange>::operator[]
                              ((ImVector<ImGuiListClipperRange> *)(lVar10 + 0x18),local_114);
          pIVar16->Min = iVar15;
          iVar15 = iVar14 + (int)((((float)iVar8 - fVar4) - fVar5) / fVar6 + 0.999999);
          pIVar16 = ImVector<ImGuiListClipperRange>::operator[]
                              ((ImVector<ImGuiListClipperRange> *)(lVar10 + 0x18),local_114);
          cVar7 = pIVar16->PosToIndexOffsetMax;
          pIVar16 = ImVector<ImGuiListClipperRange>::operator[]
                              ((ImVector<ImGuiListClipperRange> *)(lVar10 + 0x18),local_114);
          in_stack_fffffffffffffe8c = ImClamp<int>(iVar15 + cVar7,pIVar16->Min + 1,in_RDI[2]);
          pIVar16 = ImVector<ImGuiListClipperRange>::operator[]
                              ((ImVector<ImGuiListClipperRange> *)(lVar10 + 0x18),local_114);
          pIVar16->Max = in_stack_fffffffffffffe8c;
          pIVar16 = ImVector<ImGuiListClipperRange>::operator[]
                              ((ImVector<ImGuiListClipperRange> *)(lVar10 + 0x18),local_114);
          pIVar16->PosToIndexConvert = false;
        }
      }
      ImGuiListClipper_SortAndFuseRanges
                (in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    }
    if (*(int *)(lVar10 + 0xc) < *(int *)(lVar10 + 0x18)) {
      pIVar16 = ImVector<ImGuiListClipperRange>::operator[]
                          ((ImVector<ImGuiListClipperRange> *)(lVar10 + 0x18),*(int *)(lVar10 + 0xc)
                          );
      iVar15 = ImMax<int>(pIVar16->Min,iVar14);
      *in_RDI = iVar15;
      pIVar16 = ImVector<ImGuiListClipperRange>::operator[]
                          ((ImVector<ImGuiListClipperRange> *)(lVar10 + 0x18),*(int *)(lVar10 + 0xc)
                          );
      iVar15 = ImMin<int>(pIVar16->Max,in_RDI[2]);
      in_RDI[1] = iVar15;
      if (iVar14 < *in_RDI) {
        ImGuiListClipper_SeekCursorForItem(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      }
      *(int *)(lVar10 + 0xc) = *(int *)(lVar10 + 0xc) + 1;
      local_1 = true;
    }
    else {
      if (in_RDI[2] < 0x7fffffff) {
        ImGuiListClipper_SeekCursorForItem(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      }
      End(in_stack_fffffffffffffe90);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ImGuiListClipper::Step()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiListClipperData* data = (ImGuiListClipperData*)TempData;
    IM_ASSERT(data != NULL && "Called ImGuiListClipper::Step() too many times, or before ImGuiListClipper::Begin() ?");

    ImGuiTable* table = g.CurrentTable;
    if (table && table->IsInsideRow)
        ImGui::TableEndRow(table);

    // No items
    if (ItemsCount == 0 || GetSkipItemForListClipping())
        return (void)End(), false;

    // While we are in frozen row state, keep displaying items one by one, unclipped
    // FIXME: Could be stored as a table-agnostic state.
    if (data->StepNo == 0 && table != NULL && !table->IsUnfrozenRows)
    {
        DisplayStart = data->ItemsFrozen;
        DisplayEnd = data->ItemsFrozen + 1;
        if (DisplayStart >= ItemsCount)
            return (void)End(), false;
        data->ItemsFrozen++;
        return true;
    }

    // Step 0: Let you process the first element (regardless of it being visible or not, so we can measure the element height)
    bool calc_clipping = false;
    if (data->StepNo == 0)
    {
        StartPosY = window->DC.CursorPos.y;
        if (ItemsHeight <= 0.0f)
        {
            // Submit the first item (or range) so we can measure its height (generally the first range is 0..1)
            data->Ranges.push_front(ImGuiListClipperRange::FromIndices(data->ItemsFrozen, data->ItemsFrozen + 1));
            DisplayStart = ImMax(data->Ranges[0].Min, data->ItemsFrozen);
            DisplayEnd = ImMin(data->Ranges[0].Max, ItemsCount);
            if (DisplayStart == DisplayEnd)
                return (void)End(), false;
            data->StepNo = 1;
            return true;
        }
        calc_clipping = true;   // If on the first step with known item height, calculate clipping.
    }

    // Step 1: Let the clipper infer height from first range
    if (ItemsHeight <= 0.0f)
    {
        IM_ASSERT(data->StepNo == 1);
        if (table)
            IM_ASSERT(table->RowPosY1 == StartPosY && table->RowPosY2 == window->DC.CursorPos.y);

        ItemsHeight = (window->DC.CursorPos.y - StartPosY) / (float)(DisplayEnd - DisplayStart);
        bool affected_by_floating_point_precision = ImIsFloatAboveGuaranteedIntegerPrecision(StartPosY) || ImIsFloatAboveGuaranteedIntegerPrecision(window->DC.CursorPos.y);
        if (affected_by_floating_point_precision)
            ItemsHeight = window->DC.PrevLineSize.y + g.Style.ItemSpacing.y; // FIXME: Technically wouldn't allow multi-line entries.

        IM_ASSERT(ItemsHeight > 0.0f && "Unable to calculate item height! First item hasn't moved the cursor vertically!");
        calc_clipping = true;   // If item height had to be calculated, calculate clipping afterwards.
    }

    // Step 0 or 1: Calculate the actual ranges of visible elements.
    const int already_submitted = DisplayEnd;
    if (calc_clipping)
    {
        if (g.LogEnabled)
        {
            // If logging is active, do not perform any clipping
            data->Ranges.push_back(ImGuiListClipperRange::FromIndices(0, ItemsCount));
        }
        else
        {
            // Add range selected to be included for navigation
            const bool is_nav_request = (g.NavMoveScoringItems && g.NavWindow && g.NavWindow->RootWindowForNav == window->RootWindowForNav);
            if (is_nav_request)
                data->Ranges.push_back(ImGuiListClipperRange::FromPositions(g.NavScoringNoClipRect.Min.y, g.NavScoringNoClipRect.Max.y, 0, 0));
            if (is_nav_request && (g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing) && g.NavTabbingDir == -1)
                data->Ranges.push_back(ImGuiListClipperRange::FromIndices(ItemsCount - 1, ItemsCount));

            // Add focused/active item
            ImRect nav_rect_abs = ImGui::WindowRectRelToAbs(window, window->NavRectRel[0]);
            if (g.NavId != 0 && window->NavLastIds[0] == g.NavId)
                data->Ranges.push_back(ImGuiListClipperRange::FromPositions(nav_rect_abs.Min.y, nav_rect_abs.Max.y, 0, 0));

            // Add visible range
            const int off_min = (is_nav_request && g.NavMoveClipDir == ImGuiDir_Up) ? -1 : 0;
            const int off_max = (is_nav_request && g.NavMoveClipDir == ImGuiDir_Down) ? 1 : 0;
            data->Ranges.push_back(ImGuiListClipperRange::FromPositions(window->ClipRect.Min.y, window->ClipRect.Max.y, off_min, off_max));
        }

        // Convert position ranges to item index ranges
        // - Very important: when a starting position is after our maximum item, we set Min to (ItemsCount - 1). This allows us to handle most forms of wrapping.
        // - Due to how Selectable extra padding they tend to be "unaligned" with exact unit in the item list,
        //   which with the flooring/ceiling tend to lead to 2 items instead of one being submitted.
        for (int i = 0; i < data->Ranges.Size; i++)
            if (data->Ranges[i].PosToIndexConvert)
            {
                int m1 = (int)(((double)data->Ranges[i].Min - window->DC.CursorPos.y - data->LossynessOffset) / ItemsHeight);
                int m2 = (int)((((double)data->Ranges[i].Max - window->DC.CursorPos.y - data->LossynessOffset) / ItemsHeight) + 0.999999f);
                data->Ranges[i].Min = ImClamp(already_submitted + m1 + data->Ranges[i].PosToIndexOffsetMin, already_submitted, ItemsCount - 1);
                data->Ranges[i].Max = ImClamp(already_submitted + m2 + data->Ranges[i].PosToIndexOffsetMax, data->Ranges[i].Min + 1, ItemsCount);
                data->Ranges[i].PosToIndexConvert = false;
            }
        ImGuiListClipper_SortAndFuseRanges(data->Ranges, data->StepNo);
    }

    // Step 0+ (if item height is given in advance) or 1+: Display the next range in line.
    if (data->StepNo < data->Ranges.Size)
    {
        DisplayStart = ImMax(data->Ranges[data->StepNo].Min, already_submitted);
        DisplayEnd = ImMin(data->Ranges[data->StepNo].Max, ItemsCount);
        if (DisplayStart > already_submitted) //-V1051
            ImGuiListClipper_SeekCursorForItem(this, DisplayStart);
        data->StepNo++;
        return true;
    }

    // After the last step: Let the clipper validate that we have reached the expected Y position (corresponding to element DisplayEnd),
    // Advance the cursor to the end of the list and then returns 'false' to end the loop.
    if (ItemsCount < INT_MAX)
        ImGuiListClipper_SeekCursorForItem(this, ItemsCount);

    End();
    return false;
}